

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGeneric6DofSpring2Constraint.cpp
# Opt level: O3

bool btGeneric6DofSpring2Constraint::matrixToEulerXYZ(btMatrix3x3 *mat,btVector3 *xyz)

{
  bool bVar1;
  float fVar2;
  btScalar bVar3;
  float fVar4;
  
  fVar2 = mat->m_el[2].m_floats[0];
  if (1.0 <= fVar2) {
    fVar2 = atan2f(mat->m_el[0].m_floats[1],mat->m_el[1].m_floats[1]);
    xyz->m_floats[0] = fVar2;
    xyz->m_floats[1] = 1.5707964;
  }
  else {
    if (-1.0 < fVar2) {
      fVar2 = atan2f(-mat->m_el[2].m_floats[1],mat->m_el[2].m_floats[2]);
      xyz->m_floats[0] = fVar2;
      fVar2 = mat->m_el[2].m_floats[0];
      fVar4 = -1.0;
      if (-1.0 <= fVar2) {
        fVar4 = fVar2;
      }
      fVar2 = 1.0;
      if (fVar4 <= 1.0) {
        fVar2 = fVar4;
      }
      fVar2 = asinf(fVar2);
      xyz->m_floats[1] = fVar2;
      bVar3 = atan2f(-mat->m_el[1].m_floats[0],mat->m_el[0].m_floats[0]);
      bVar1 = true;
      goto LAB_00192cb2;
    }
    fVar2 = atan2f(mat->m_el[0].m_floats[1],mat->m_el[1].m_floats[1]);
    xyz->m_floats[0] = -fVar2;
    xyz->m_floats[1] = -1.5707964;
  }
  bVar3 = 0.0;
  bVar1 = false;
LAB_00192cb2:
  xyz->m_floats[2] = bVar3;
  return bVar1;
}

Assistant:

bool btGeneric6DofSpring2Constraint::matrixToEulerXYZ(const btMatrix3x3& mat,btVector3& xyz)
{
	// rot =  cy*cz          -cy*sz           sy
	//        cz*sx*sy+cx*sz  cx*cz-sx*sy*sz -cy*sx
	//       -cx*cz*sy+sx*sz  cz*sx+cx*sy*sz  cx*cy

	btScalar fi = btGetMatrixElem(mat,2);
	if (fi < btScalar(1.0f))
	{
		if (fi > btScalar(-1.0f))
		{
			xyz[0] = btAtan2(-btGetMatrixElem(mat,5),btGetMatrixElem(mat,8));
			xyz[1] = btAsin(btGetMatrixElem(mat,2));
			xyz[2] = btAtan2(-btGetMatrixElem(mat,1),btGetMatrixElem(mat,0));
			return true;
		}
		else
		{
			// WARNING.  Not unique.  XA - ZA = -atan2(r10,r11)
			xyz[0] = -btAtan2(btGetMatrixElem(mat,3),btGetMatrixElem(mat,4));
			xyz[1] = -SIMD_HALF_PI;
			xyz[2] = btScalar(0.0);
			return false;
		}
	}
	else
	{
		// WARNING.  Not unique.  XAngle + ZAngle = atan2(r10,r11)
		xyz[0] = btAtan2(btGetMatrixElem(mat,3),btGetMatrixElem(mat,4));
		xyz[1] = SIMD_HALF_PI;
		xyz[2] = 0.0;
	}
	return false;
}